

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::InternReadFile
          (X3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t *psVar1;
  size_t *this_00;
  size_type sVar2;
  bool bVar3;
  aiNode *this_01;
  reference ppCVar4;
  size_type sVar5;
  pointer pbVar6;
  reference ppaVar7;
  reference ppaVar8;
  reference ppaVar9;
  _List_const_iterator<aiLight_*> local_108;
  ulong local_100;
  size_t i_2;
  _List_const_iterator<aiLight_*> local_f0;
  const_iterator it_2;
  ulong local_e0;
  size_t i_1;
  _List_const_iterator<aiMaterial_*> local_d0;
  const_iterator it_1;
  ulong local_c0;
  size_t i;
  _List_const_iterator<aiMesh_*> local_b0;
  const_iterator it;
  list<aiLight_*,_std::allocator<aiLight_*>_> light_list;
  list<aiMaterial_*,_std::allocator<aiMaterial_*>_> mat_list;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> mesh_list;
  string local_50 [32];
  long local_30;
  size_type slashPos;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  X3DImporter *this_local;
  
  this->mpIOHandler = pIOHandler;
  slashPos = (size_type)pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  Clear(this);
  local_30 = std::__cxx11::string::find_last_of((char *)pScene_local,0xc1bb16);
  sVar2 = slashPos;
  if (local_30 == -1) {
    std::__cxx11::string::string(local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)pScene_local);
  }
  (**(code **)(*(long *)sVar2 + 0x38))(sVar2,local_50);
  std::__cxx11::string::~string(local_50);
  ParseFile(this,(string *)pScene_local,(IOSystem *)slashPos);
  (**(code **)(*(long *)slashPos + 0x50))();
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  (pIOHandler_local->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
  (pIOHandler_local->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[0x22]._M_string_length = 0;
  *(uint *)&pIOHandler_local->_vptr_IOSystem = *(uint *)&pIOHandler_local->_vptr_IOSystem | 0x20;
  ppCVar4 = std::__cxx11::
            list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::front
                      (&this->NodeElement_List);
  this->NodeElement_Cur = *ppCVar4;
  while (this->NodeElement_Cur->Parent != (CX3DImporter_NodeElement *)0x0) {
    this->NodeElement_Cur = this->NodeElement_Cur->Parent;
  }
  psVar1 = &mat_list.super__List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl._M_node.
            _M_size;
  std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::list
            ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)psVar1);
  this_00 = &light_list.super__List_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl._M_node.
             _M_size;
  std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::list
            ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_00);
  std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::list
            ((list<aiLight_*,_std::allocator<aiLight_*>_> *)&it);
  Postprocess_BuildNode
            (this,this->NodeElement_Cur,
             (aiNode *)
             (pIOHandler_local->m_pathStack).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (list<aiMesh_*,_std::allocator<aiMesh_*>_> *)psVar1,
             (list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_00,
             (list<aiLight_*,_std::allocator<aiLight_*>_> *)&it);
  bVar3 = std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                    ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                     &mat_list.super__List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                      ._M_node._M_size);
  if (!bVar3) {
    psVar1 = &mat_list.super__List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl._M_node
              ._M_size;
    i = (size_t)std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                          ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)psVar1);
    std::_List_const_iterator<aiMesh_*>::_List_const_iterator(&local_b0,(iterator *)&i);
    sVar5 = std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)psVar1);
    *(int *)&(pIOHandler_local->m_pathStack).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = (int)sVar5;
    pbVar6 = (pointer)operator_new__((ulong)*(uint *)&(pIOHandler_local->m_pathStack).
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish << 3);
    (pIOHandler_local->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
    for (local_c0 = 0;
        local_c0 <
        *(uint *)&(pIOHandler_local->m_pathStack).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; local_c0 = local_c0 + 1) {
      it_1._M_node = (_List_node_base *)std::_List_const_iterator<aiMesh_*>::operator++(&local_b0,0)
      ;
      ppaVar7 = std::_List_const_iterator<aiMesh_*>::operator*
                          ((_List_const_iterator<aiMesh_*> *)&it_1);
      *(aiMesh **)
       (&((pIOHandler_local->m_pathStack).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus + local_c0 * 8) =
           *ppaVar7;
    }
  }
  bVar3 = std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::empty
                    ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                     &light_list.super__List_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                      _M_node._M_size);
  if (!bVar3) {
    psVar1 = &light_list.super__List_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl._M_node.
              _M_size;
    i_1 = (size_t)std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin
                            ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)psVar1);
    std::_List_const_iterator<aiMaterial_*>::_List_const_iterator(&local_d0,(iterator *)&i_1);
    sVar5 = std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                      ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)psVar1);
    *(int *)&pIOHandler_local[1]._vptr_IOSystem = (int)sVar5;
    pbVar6 = (pointer)operator_new__((ulong)*(uint *)&pIOHandler_local[1]._vptr_IOSystem << 3);
    pIOHandler_local[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar6;
    for (local_e0 = 0; local_e0 < *(uint *)&pIOHandler_local[1]._vptr_IOSystem;
        local_e0 = local_e0 + 1) {
      it_2._M_node = (_List_node_base *)
                     std::_List_const_iterator<aiMaterial_*>::operator++(&local_d0,0);
      ppaVar8 = std::_List_const_iterator<aiMaterial_*>::operator*
                          ((_List_const_iterator<aiMaterial_*> *)&it_2);
      *(aiMaterial **)
       (&(pIOHandler_local[1].m_pathStack.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + local_e0 * 8) = *ppaVar8;
    }
  }
  bVar3 = std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::empty
                    ((list<aiLight_*,_std::allocator<aiLight_*>_> *)&it);
  if (!bVar3) {
    i_2 = (size_t)std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::begin
                            ((list<aiLight_*,_std::allocator<aiLight_*>_> *)&it);
    std::_List_const_iterator<aiLight_*>::_List_const_iterator(&local_f0,(iterator *)&i_2);
    sVar5 = std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::size
                      ((list<aiLight_*,_std::allocator<aiLight_*>_> *)&it);
    *(int *)&pIOHandler_local[2].m_pathStack.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = (int)sVar5;
    pbVar6 = (pointer)operator_new__((ulong)*(uint *)&pIOHandler_local[2].m_pathStack.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish << 3);
    pIOHandler_local[2].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
    for (local_100 = 0;
        local_100 <
        *(uint *)&pIOHandler_local[2].m_pathStack.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; local_100 = local_100 + 1) {
      local_108._M_node =
           (_List_node_base *)std::_List_const_iterator<aiLight_*>::operator++(&local_f0,0);
      ppaVar9 = std::_List_const_iterator<aiLight_*>::operator*(&local_108);
      *(aiLight **)
       (&(pIOHandler_local[2].m_pathStack.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus + local_100 * 8) =
           *ppaVar9;
    }
  }
  std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::~list
            ((list<aiLight_*,_std::allocator<aiLight_*>_> *)&it);
  std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~list
            ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
             &light_list.super__List_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl._M_node.
              _M_size);
  std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::~list
            ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
             &mat_list.super__List_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl._M_node
              ._M_size);
  return;
}

Assistant:

void X3DImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
	mpIOHandler = pIOHandler;

	Clear();// delete old graph.
	std::string::size_type slashPos = pFile.find_last_of("\\/");
	pIOHandler->PushDirectory(slashPos == std::string::npos ? std::string() : pFile.substr(0, slashPos + 1));
	ParseFile(pFile, pIOHandler);
	pIOHandler->PopDirectory();
	//
	// Assimp use static arrays of objects for fast speed of rendering. That's good, but need some additional operations/
	// We know that geometry objects(meshes) are stored in <Shape>, also in <Shape>-><Appearance> materials(in Assimp logical view)
	// are stored. So at first we need to count how meshes and materials are stored in scene graph.
	//
	// at first creating root node for aiScene.
	pScene->mRootNode = new aiNode;
	pScene->mRootNode->mParent = nullptr;
	pScene->mFlags |= AI_SCENE_FLAGS_ALLOW_SHARED;
	//search for root node element
	NodeElement_Cur = NodeElement_List.front();
	while(NodeElement_Cur->Parent != nullptr) NodeElement_Cur = NodeElement_Cur->Parent;

	{// fill aiScene with objects.
		std::list<aiMesh*> mesh_list;
		std::list<aiMaterial*> mat_list;
		std::list<aiLight*> light_list;

		// create nodes tree
		Postprocess_BuildNode(*NodeElement_Cur, *pScene->mRootNode, mesh_list, mat_list, light_list);
		// copy needed data to scene
		if(!mesh_list.empty())
		{
			std::list<aiMesh*>::const_iterator it = mesh_list.begin();

			pScene->mNumMeshes = static_cast<unsigned int>(mesh_list.size());
			pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
			for(size_t i = 0; i < pScene->mNumMeshes; i++) pScene->mMeshes[i] = *it++;
		}

		if(!mat_list.empty())
		{
			std::list<aiMaterial*>::const_iterator it = mat_list.begin();

			pScene->mNumMaterials = static_cast<unsigned int>(mat_list.size());
			pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
			for(size_t i = 0; i < pScene->mNumMaterials; i++) pScene->mMaterials[i] = *it++;
		}

		if(!light_list.empty())
		{
			std::list<aiLight*>::const_iterator it = light_list.begin();

			pScene->mNumLights = static_cast<unsigned int>(light_list.size());
			pScene->mLights = new aiLight*[pScene->mNumLights];
			for(size_t i = 0; i < pScene->mNumLights; i++) pScene->mLights[i] = *it++;
		}
	}// END: fill aiScene with objects.

	///TODO: IME optimize tree
}